

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::InitializeAppend
          (RowGroupCollection *this,TransactionData transaction,TableAppendState *state)

{
  __int_type _Var1;
  bool bVar2;
  RowGroupSegmentTree *pRVar3;
  RowGroup *this_00;
  unique_lock<std::mutex> uStack_68;
  TableStatistics local_58;
  
  _Var1 = (this->total_rows).super___atomic_base<unsigned_long>._M_i;
  state->row_start = _Var1;
  state->current_row = _Var1;
  state->total_append_count = 0;
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  ::std::unique_lock<std::mutex>::unique_lock
            (&uStack_68,&(pRVar3->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  bVar2 = IsEmpty(this,(SegmentLock *)&uStack_68);
  if (bVar2) {
    AppendRowGroup(this,(SegmentLock *)&uStack_68,this->row_start);
  }
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_00 = SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
                      (&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&uStack_68)
  ;
  state->start_row_group = this_00;
  RowGroup::InitializeAppend(this_00,&state->row_group_append_state);
  (state->transaction).start_time = transaction.start_time;
  (state->transaction).transaction.ptr = transaction.transaction.ptr;
  (state->transaction).transaction_id = transaction.transaction_id;
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
       (__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
        )0x0;
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TableStatistics::operator=(&state->stats,&local_58);
  TableStatistics::~TableStatistics(&local_58);
  TableStatistics::InitializeEmpty(&state->stats,&this->types);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_68);
  return;
}

Assistant:

void RowGroupCollection::InitializeAppend(TransactionData transaction, TableAppendState &state) {
	state.row_start = UnsafeNumericCast<row_t>(total_rows.load());
	state.current_row = state.row_start;
	state.total_append_count = 0;

	// start writing to the row_groups
	auto l = row_groups->Lock();
	if (IsEmpty(l)) {
		// empty row group collection: empty first row group
		AppendRowGroup(l, row_start);
	}
	state.start_row_group = row_groups->GetLastSegment(l);
	D_ASSERT(this->row_start + total_rows == state.start_row_group->start + state.start_row_group->count);
	state.start_row_group->InitializeAppend(state.row_group_append_state);
	state.transaction = transaction;

	// initialize thread-local stats so we have less lock contention when updating distinct statistics
	state.stats = TableStatistics();
	state.stats.InitializeEmpty(types);
}